

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O0

string * banksia::formatPeriod_abi_cxx11_(int seconds)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  int in_ESI;
  string *in_RDI;
  ostringstream stringStream;
  int d;
  int h;
  int hours;
  int m;
  int minutes;
  int s;
  ostringstream local_1a0 [380];
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  
  local_10 = in_ESI % 0x3c;
  local_14 = in_ESI / 0x3c;
  local_18 = local_14 % 0x3c;
  local_1c = local_14 / 0x3c;
  local_20 = local_1c % 0x18;
  local_24 = local_1c / 0x18;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (0 < local_24) {
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,local_24);
    std::operator<<(poVar3,"d ");
  }
  if (0 < local_20) {
    poVar3 = (ostream *)std::ostream::operator<<(local_1a0,local_20);
    poVar3 = std::operator<<(poVar3,":");
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    _Var2 = std::setw(2);
    std::operator<<(poVar3,_Var2);
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_1a0,local_18);
  poVar3 = std::operator<<(poVar3,":");
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  uVar4 = std::ostream::operator<<(poVar3,local_10);
  _Var1 = std::setfill<char>(' ');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(0);
  std::operator<<(poVar3,_Var2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string formatPeriod(int seconds)
    {
        int s = seconds % 60, minutes = seconds / 60, m = minutes % 60, hours = minutes / 60, h = hours % 24, d = hours / 24;
        
        std::ostringstream stringStream;
        if (d > 0) {
            stringStream << d << "d ";
        }
        if (h > 0) {
            stringStream << h << ":"
            << std::setfill('0') << std::setw(2);
        }
        
        stringStream
        << m << ":"
        << std::setfill('0') << std::setw(2)
        << s
        << std::setfill(' ') << std::setw(0);
        return stringStream.str();
    }